

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O0

char * btorsim_bv_to_hex_char(BtorSimBitVector *bv)

{
  char cVar1;
  uint32_t uVar2;
  char *pcVar3;
  BtorSimBitVector *in_RDI;
  char ch;
  char *res;
  uint32_t tmp;
  uint32_t k;
  uint32_t j;
  uint32_t i;
  uint32_t len;
  size_t in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined2 in_stack_ffffffffffffffd4;
  undefined1 in_stack_ffffffffffffffd6;
  undefined1 in_stack_ffffffffffffffd7;
  uint local_1c;
  uint local_18;
  uint local_14;
  uint local_10;
  
  local_14 = in_RDI->width + 3 >> 2;
  pcVar3 = (char *)btorsim_calloc(CONCAT17(in_stack_ffffffffffffffd7,
                                           CONCAT16(in_stack_ffffffffffffffd6,
                                                    CONCAT24(in_stack_ffffffffffffffd4,
                                                             in_stack_ffffffffffffffd0))),
                                  in_stack_ffffffffffffffc8);
  local_10 = 0;
  while (local_14 = local_14 - 1, local_10 < in_RDI->width) {
    local_1c = btorsim_bv_get_bit(in_RDI,local_10);
    for (local_18 = 1; local_10 = local_10 + 1, local_10 < in_RDI->width && local_18 < 4;
        local_18 = local_18 + 1) {
      uVar2 = btorsim_bv_get_bit(in_RDI,local_10);
      local_1c = uVar2 << ((byte)local_18 & 0x1f) | local_1c;
    }
    if (local_1c < 10) {
      cVar1 = (char)local_1c + '0';
    }
    else {
      cVar1 = (char)local_1c + 'W';
    }
    pcVar3[local_14] = cVar1;
  }
  return pcVar3;
}

Assistant:

char *
btorsim_bv_to_hex_char (const BtorSimBitVector *bv)
{
  assert (bv);

  uint32_t len, i, j, k, tmp;
  char *res, ch;

  len = (bv->width + 3) / 4;
  BTOR2_CNEWN (res, len + 1);
  for (i = 0, j = len - 1; i < bv->width;)
  {
    tmp = btorsim_bv_get_bit (bv, i++);
    for (k = 1; i < bv->width && k <= 3; i++, k++)
      tmp |= btorsim_bv_get_bit (bv, i) << k;
    ch       = tmp < 10 ? '0' + tmp : 'a' + (tmp - 10);
    res[j--] = ch;
  }

  return res;
}